

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::NodeEqualChecker::cmpNodeVector<SQCompilation::Expr>
          (NodeEqualChecker *this,ArenaVector<SQCompilation::Expr_*> *lhs,
          ArenaVector<SQCompilation::Expr_*> *rhs)

{
  bool bVar1;
  size_type_conflict sVar2;
  size_type_conflict sVar3;
  ArenaVector<SQCompilation::Expr_*> *in_RDX;
  ArenaVector<SQCompilation::Expr_*> *in_RSI;
  Node *in_RDI;
  int32_t i;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  uint pos;
  bool local_1;
  
  sVar2 = ArenaVector<SQCompilation::Expr_*>::size(in_RSI);
  sVar3 = ArenaVector<SQCompilation::Expr_*>::size(in_RDX);
  if (sVar2 == sVar3) {
    uVar4 = 0;
    while (pos = uVar4, sVar3 = ArenaVector<SQCompilation::Expr_*>::size(in_RSI), uVar4 < sVar3) {
      ArenaVector<SQCompilation::Expr_*>::operator[](in_RSI,pos);
      ArenaVector<SQCompilation::Expr_*>::operator[](in_RDX,pos);
      bVar1 = check((NodeEqualChecker *)CONCAT44(pos,sVar2),in_RDI,
                    (Node *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      if (!bVar1) {
        return false;
      }
      uVar4 = pos + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool cmpNodeVector(const ArenaVector<N *> &lhs, const ArenaVector<N *> &rhs) const {
    if (lhs.size() != rhs.size())
      return false;

    for (int32_t i = 0; i < lhs.size(); ++i) {
      if (!check(lhs[i], rhs[i]))
        return false;
    }

    return true;
  }